

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_p1363_test.cc
# Opt level: O2

void __thiscall
ECDSAP1363Test_SignSucceedsWithLargeBuffer_Test::TestBody
          (ECDSAP1363Test_SignSucceedsWithLargeBuffer_Test *this)

{
  pointer *this_00;
  bool bVar1;
  UniquePtr<EC_KEY> key_00;
  int iVar2;
  EC_GROUP *group;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar3;
  char *pcVar4;
  char *in_R9;
  _Head_base<0UL,_ec_key_st_*,_false> expected_predicate_value;
  AssertionResult gtest_ar__4;
  AssertHelper local_88;
  size_t sig_len;
  UniquePtr<EC_KEY> key;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  size_t out_sig_len;
  uint8_t digest [20];
  
  iVar2 = RAND_bytes(digest,0x14);
  this_00 = &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = iVar2 != 0;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = bVar1;
  if (iVar2 == 0) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&sig,
               (AssertionResult *)"RAND_bytes(digest, sizeof(digest))","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
               ,0xa8,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&key,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
    return;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)EC_KEY_new();
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       (tuple<ec_key_st_*,_bssl::internal::Deleter>)
       key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ec_key_st_*,_false>)0x0;
  if ((tuple<ec_key_st_*,_bssl::internal::Deleter>)
      key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ec_key_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&sig,(AssertionResult *)0x55f7b2,"false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig_len,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
               ,0xab,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&sig_len,(Message *)&gtest_ar__4);
LAB_002421ce:
    puVar3 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig_len);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    key_00._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
         key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl;
    group = EC_group_p256();
    iVar2 = EC_KEY_set_group((EC_KEY *)
                             key_00._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,
                             (EC_GROUP *)group);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&gtest_ar__4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&sig,
                 (AssertionResult *)"EC_KEY_set_group(key.get(), EC_group_p256())","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&sig_len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                 ,0xac,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&sig_len,(Message *)&gtest_ar__4);
      goto LAB_002421ce;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    iVar2 = EC_KEY_generate_key((EC_KEY *)
                                key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&gtest_ar__4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&sig,
                 (AssertionResult *)"EC_KEY_generate_key(key.get())","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&sig_len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                 ,0xad,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&sig_len,(Message *)&gtest_ar__4);
      goto LAB_002421ce;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    sig_len = ECDSA_size_p1363((EC_KEY *)
                               key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
              ((internal *)&gtest_ar,"sig_len","0u",&sig_len,(uint *)&sig);
    if (gtest_ar.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      gtest_ar.success_ = true;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&sig,sig_len + 1,&gtest_ar.success_,(allocator_type *)&gtest_ar__4);
      expected_predicate_value._M_head_impl = (ec_key_st *)key;
      iVar2 = ECDSA_sign_p1363(digest,0x14,
                               (uint8_t *)
                               CONCAT44(sig.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        sig.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_4_),
                               &out_sig_len,
                               (long)sig.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)CONCAT44(sig.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              sig.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_),
                               (EC_KEY *)
                               key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
      gtest_ar__4.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__4.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_88);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar__4,
                   (AssertionResult *)
                   "ECDSA_sign_p1363(digest, sizeof(digest), sig.data(), &out_sig_len, sig.size(), key.get())"
                   ,"false","true",(char *)expected_predicate_value._M_head_impl);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                   ,0xb5,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
LAB_00242413:
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (local_88.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_88.data_ + 8))();
        }
LAB_00242437:
        puVar3 = &gtest_ar__4.message_;
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__4.message_);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"out_sig_len","sig_len",&out_sig_len,&sig_len);
        if (gtest_ar.success_ != false) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          gtest_ar__4.success_ = true;
          testing::internal::CmpHelperEQ<unsigned_char,char>
                    ((internal *)&gtest_ar,"sig.back()","\'x\'",
                     sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1,&gtest_ar__4.success_);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__4);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_88,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                       ,0xb8,pcVar4);
            testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar__4);
            testing::internal::AssertHelper::~AssertHelper(&local_88);
            if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          iVar2 = ECDSA_verify_p1363(digest,0x14,
                                     (uint8_t *)
                                     CONCAT44(sig.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              sig.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_),
                                     out_sig_len,
                                     (EC_KEY *)
                                     key._M_t.
                                     super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
          gtest_ar__4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__4.success_ = iVar2 != 0;
          if (!gtest_ar__4.success_) {
            testing::Message::Message((Message *)&local_88);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__4,
                       (AssertionResult *)
                       "ECDSA_verify_p1363(digest, sizeof(digest), sig.data(), out_sig_len, key.get())"
                       ,"false","true",(char *)expected_predicate_value._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                       ,0xbb,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
            goto LAB_00242413;
          }
          goto LAB_00242437;
        }
        testing::Message::Message((Message *)&gtest_ar__4);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                   ,0xb6,pcVar4);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar__4);
        puVar3 = &gtest_ar.message_;
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(puVar3);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      goto LAB_002421f9;
    }
    testing::Message::Message((Message *)&sig);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
               ,0xb0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&sig);
    puVar3 = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    if ((long *)CONCAT44(sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(sig.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     sig.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(puVar3);
LAB_002421f9:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&key);
  return;
}

Assistant:

TEST(ECDSAP1363Test, SignSucceedsWithLargeBuffer) {
  // Fill digest values with some random data.
  uint8_t digest[20];
  ASSERT_TRUE(RAND_bytes(digest, sizeof(digest)));

  bssl::UniquePtr<EC_KEY> key(EC_KEY_new());
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_set_group(key.get(), EC_group_p256()));
  ASSERT_TRUE(EC_KEY_generate_key(key.get()));

  size_t sig_len = ECDSA_size_p1363(key.get());
  ASSERT_GT(sig_len, 0u);
  std::vector<uint8_t> sig(sig_len + 1, 'x');

  size_t out_sig_len;
  ASSERT_TRUE(ECDSA_sign_p1363(digest, sizeof(digest), sig.data(),
                                &out_sig_len, sig.size(), key.get()));
  ASSERT_EQ(out_sig_len, sig_len);
  // The extra byte should be untouched.
  EXPECT_EQ(sig.back(), 'x');

  ASSERT_TRUE(ECDSA_verify_p1363(digest, sizeof(digest), sig.data(),
                                 out_sig_len, key.get()));
}